

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O0

int N_VLinearCombinationVectorArray_Serial(int nvec,int nsum,realtype *c,N_Vector **X,N_Vector *Z)

{
  long lVar1;
  long lVar2;
  void *pvVar3;
  long *in_RCX;
  double *in_RDX;
  int in_ESI;
  int in_EDI;
  undefined8 *in_R8;
  N_Vector *Y;
  realtype *ctmp;
  N_Vector in_stack_00000018;
  int retval;
  realtype *xd;
  realtype *zd;
  sunindextype N;
  sunindextype k;
  int j;
  int i;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  N_Vector z;
  N_Vector *X_00;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int iVar4;
  int in_stack_ffffffffffffffd0;
  int iVar5;
  int iVar6;
  int local_2c;
  int local_4;
  
  X_00 = (N_Vector *)0x0;
  z = (N_Vector)0x0;
  if (in_EDI < 1) {
    local_4 = -1;
  }
  else if (in_ESI < 1) {
    local_4 = -1;
  }
  else if (in_EDI == 1) {
    if (in_ESI == 1) {
      N_VScale_Serial(0.0,(N_Vector)0x0,
                      (N_Vector)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
      local_4 = 0;
    }
    else if (in_ESI == 2) {
      N_VLinearSum_Serial((realtype)_N,(N_Vector)zd,(realtype)xd,in_stack_00000018,(N_Vector)ctmp);
      local_4 = 0;
    }
    else {
      pvVar3 = malloc((long)in_ESI << 3);
      for (local_2c = 0; local_2c < in_ESI; local_2c = local_2c + 1) {
        *(undefined8 *)((long)pvVar3 + (long)local_2c * 8) = *(undefined8 *)in_RCX[local_2c];
      }
      local_4 = N_VLinearCombination_Serial
                          (in_stack_ffffffffffffffd0,
                           (realtype *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)
                           ,X_00,z);
      free(pvVar3);
    }
  }
  else if (in_ESI == 1) {
    pvVar3 = malloc((long)in_EDI << 3);
    for (iVar5 = 0; iVar5 < in_EDI; iVar5 = iVar5 + 1) {
      *(double *)((long)pvVar3 + (long)iVar5 * 8) = *in_RDX;
    }
    local_4 = N_VScaleVectorArray_Serial
                        (iVar5,(realtype *)
                               CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),X_00,
                         (N_Vector *)z);
    free(pvVar3);
  }
  else if (in_ESI == 2) {
    local_4 = N_VLinearSumVectorArray_Serial
                        ((int)Z,_j,_N,(realtype)zd,(N_Vector *)xd,(N_Vector *)in_stack_00000018);
  }
  else {
    iVar5 = **(int **)*in_R8;
    if ((((undefined8 *)*in_RCX != in_R8) || (*in_RDX != 1.0)) || (NAN(*in_RDX))) {
      if ((undefined8 *)*in_RCX == in_R8) {
        for (iVar6 = 0; iVar6 < in_EDI; iVar6 = iVar6 + 1) {
          lVar1 = *(long *)(*(long *)in_R8[iVar6] + 8);
          for (iVar4 = 0; iVar4 < iVar5; iVar4 = iVar4 + 1) {
            *(double *)(lVar1 + (long)iVar4 * 8) = *in_RDX * *(double *)(lVar1 + (long)iVar4 * 8);
          }
          for (local_2c = 1; local_2c < in_ESI; local_2c = local_2c + 1) {
            lVar2 = *(long *)(**(long **)(in_RCX[local_2c] + (long)iVar6 * 8) + 8);
            for (iVar4 = 0; iVar4 < iVar5; iVar4 = iVar4 + 1) {
              *(double *)(lVar1 + (long)iVar4 * 8) =
                   in_RDX[local_2c] * *(double *)(lVar2 + (long)iVar4 * 8) +
                   *(double *)(lVar1 + (long)iVar4 * 8);
            }
          }
        }
        local_4 = 0;
      }
      else {
        for (iVar6 = 0; iVar6 < in_EDI; iVar6 = iVar6 + 1) {
          lVar1 = *(long *)(**(long **)(*in_RCX + (long)iVar6 * 8) + 8);
          lVar2 = *(long *)(*(long *)in_R8[iVar6] + 8);
          for (iVar4 = 0; iVar4 < iVar5; iVar4 = iVar4 + 1) {
            *(double *)(lVar2 + (long)iVar4 * 8) = *in_RDX * *(double *)(lVar1 + (long)iVar4 * 8);
          }
          for (local_2c = 1; local_2c < in_ESI; local_2c = local_2c + 1) {
            lVar1 = *(long *)(**(long **)(in_RCX[local_2c] + (long)iVar6 * 8) + 8);
            for (iVar4 = 0; iVar4 < iVar5; iVar4 = iVar4 + 1) {
              *(double *)(lVar2 + (long)iVar4 * 8) =
                   in_RDX[local_2c] * *(double *)(lVar1 + (long)iVar4 * 8) +
                   *(double *)(lVar2 + (long)iVar4 * 8);
            }
          }
        }
        local_4 = 0;
      }
    }
    else {
      for (iVar6 = 0; iVar6 < in_EDI; iVar6 = iVar6 + 1) {
        lVar1 = *(long *)(*(long *)in_R8[iVar6] + 8);
        for (local_2c = 1; local_2c < in_ESI; local_2c = local_2c + 1) {
          lVar2 = *(long *)(**(long **)(in_RCX[local_2c] + (long)iVar6 * 8) + 8);
          for (iVar4 = 0; iVar4 < iVar5; iVar4 = iVar4 + 1) {
            *(double *)(lVar1 + (long)iVar4 * 8) =
                 in_RDX[local_2c] * *(double *)(lVar2 + (long)iVar4 * 8) +
                 *(double *)(lVar1 + (long)iVar4 * 8);
          }
        }
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int N_VLinearCombinationVectorArray_Serial(int nvec, int nsum, realtype* c,
                                           N_Vector** X, N_Vector* Z)
{
  int          i; /* vector arrays index in summation [0,nsum) */
  int          j; /* vector index in vector array     [0,nvec) */
  sunindextype k; /* element index in vector          [0,N)    */
  sunindextype N;
  realtype*    zd=NULL;
  realtype*    xd=NULL;

  int          retval;
  realtype*    ctmp;
  N_Vector*   Y;

  /* invalid number of vectors */
  if (nvec < 1) return(-1);
  if (nsum < 1) return(-1);

  /* ---------------------------
   * Special cases for nvec == 1
   * --------------------------- */

  if (nvec == 1) {

    /* should have called N_VScale */
    if (nsum == 1) {
      N_VScale_Serial(c[0], X[0][0], Z[0]);
      return(0);
    }

    /* should have called N_VLinearSum */
    if (nsum == 2) {
      N_VLinearSum_Serial(c[0], X[0][0], c[1], X[1][0], Z[0]);
      return(0);
    }

    /* should have called N_VLinearCombination */
    Y = (N_Vector*) malloc(nsum * sizeof(N_Vector));

    for (i=0; i<nsum; i++) {
      Y[i] = X[i][0];
    }

    retval = N_VLinearCombination_Serial(nsum, c, Y, Z[0]);

    free(Y);
    return(retval);
  }

  /* --------------------------
   * Special cases for nvec > 1
   * -------------------------- */

  /* should have called N_VScaleVectorArray */
  if (nsum == 1) {

    ctmp = (realtype*) malloc(nvec * sizeof(realtype));

    for (j=0; j<nvec; j++) {
      ctmp[j] = c[0];
    }

    retval = N_VScaleVectorArray_Serial(nvec, ctmp, X[0], Z);

    free(ctmp);
    return(retval);
  }

  /* should have called N_VLinearSumVectorArray */
  if (nsum == 2) {
    retval = N_VLinearSumVectorArray_Serial(nvec, c[0], X[0], c[1], X[1], Z);
    return(retval);
  }

  /* --------------------------
   * Compute linear combination
   * -------------------------- */

  /* get vector length */
  N = NV_LENGTH_S(Z[0]);

  /*
   * X[0][j] += c[i]*X[i][j], i = 1,...,nvec-1
   */
  if ((X[0] == Z) && (c[0] == ONE)) {
    for (j=0; j<nvec; j++) {
      zd = NV_DATA_S(Z[j]);
      for (i=1; i<nsum; i++) {
        xd = NV_DATA_S(X[i][j]);
        for (k=0; k<N; k++) {
          zd[k] += c[i] * xd[k];
        }
      }
    }
    return(0);
  }

  /*
   * X[0][j] = c[0] * X[0][j] + sum{ c[i] * X[i][j] }, i = 1,...,nvec-1
   */
  if (X[0] == Z) {
    for (j=0; j<nvec; j++) {
      zd = NV_DATA_S(Z[j]);
      for (k=0; k<N; k++) {
        zd[k] *= c[0];
      }
      for (i=1; i<nsum; i++) {
        xd = NV_DATA_S(X[i][j]);
        for (k=0; k<N; k++) {
          zd[k] += c[i] * xd[k];
        }
      }
    }
    return(0);
  }

  /*
   * Z[j] = sum{ c[i] * X[i][j] }, i = 0,...,nvec-1
   */
  for (j=0; j<nvec; j++) {
    xd = NV_DATA_S(X[0][j]);
    zd = NV_DATA_S(Z[j]);
    for (k=0; k<N; k++) {
      zd[k] = c[0] * xd[k];
    }
    for (i=1; i<nsum; i++) {
      xd = NV_DATA_S(X[i][j]);
      for (k=0; k<N; k++) {
        zd[k] += c[i] * xd[k];
      }
    }
  }
  return(0);
}